

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

void __thiscall
Potassco::SmodelsOutput::rule(SmodelsOutput *this,Head_t ht,AtomSpan *head,LitSpan *body)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AtomSpan *in_RCX;
  SmodelsOutput *in_RDX;
  E in_ESI;
  SmodelsOutput *in_RDI;
  SmodelsRule rt;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  Head_t HVar4;
  undefined1 in_stack_ffffffffffffffc8 [16];
  undefined4 in_stack_ffffffffffffffd8;
  SmodelsOutput *pSVar5;
  Head_t local_4;
  
  if (in_RDI->sec_ != 0) {
    fail(-2,"virtual void Potassco::SmodelsOutput::rule(Head_t, const AtomSpan &, const LitSpan &)",
         0x137,"sec_ == 0","adding rules after symbols not supported",0);
  }
  pSVar5 = in_RDI;
  local_4.val_ = in_ESI;
  bVar1 = empty<unsigned_int>((Span<unsigned_int> *)in_RDX);
  HVar4.val_ = (E)((ulong)pSVar5 >> 0x20);
  if (bVar1) {
    uVar2 = Head_t::operator_cast_to_unsigned_int(&local_4);
    if (uVar2 != 1) {
      if (in_RDI->false_ == 0) {
        fail(-2,
             "virtual void Potassco::SmodelsOutput::rule(Head_t, const AtomSpan &, const LitSpan &)"
             ,0x13b,"false_ != 0","empty head requires false atom",0);
      }
      in_RDI->fHead_ = true;
      toSpan<unsigned_int>(&in_RDI->false_,1);
      rule(in_RDX,HVar4,in_RCX,(LitSpan *)CONCAT44(local_4.val_,in_stack_ffffffffffffffd8));
    }
  }
  else {
    HVar4.val_ = local_4.val_;
    iVar3 = isSmodelsHead((Head_t)(E)in_RDI,
                          (AtomSpan *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
    ;
    if (iVar3 == 0) {
      fail(-2,
           "virtual void Potassco::SmodelsOutput::rule(Head_t, const AtomSpan &, const LitSpan &)",
           0x141,"rt != End","unsupported rule type",0);
    }
    startRule(in_RDI,in_stack_ffffffffffffffac);
    add(in_stack_ffffffffffffffc8._0_8_,(Head_t)in_stack_ffffffffffffffc8._12_4_,
        (AtomSpan *)CONCAT44(iVar3,HVar4.val_));
    add((SmodelsOutput *)CONCAT44(iVar3,HVar4.val_),
        (LitSpan *)CONCAT44(local_4.val_,in_stack_ffffffffffffffb8));
    endRule(in_RDI);
  }
  return;
}

Assistant:

void SmodelsOutput::rule(Head_t ht, const AtomSpan& head, const LitSpan& body) {
	POTASSCO_REQUIRE(sec_ == 0, "adding rules after symbols not supported");
	if (empty(head)) {
		if (ht == Head_t::Choice) { return; }
		else {
			POTASSCO_REQUIRE(false_ != 0, "empty head requires false atom");
			fHead_ = true;
			return SmodelsOutput::rule(ht, toSpan(&false_, 1), body);
		}
	}
	SmodelsRule rt = (SmodelsRule)isSmodelsHead(ht, head);
	POTASSCO_REQUIRE(rt != End, "unsupported rule type");
	startRule(rt).add(ht, head).add(body).endRule();
}